

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vw_exception.cc
# Opt level: O0

void __thiscall VW::vw_exception::~vw_exception(vw_exception *this)

{
  vw_exception *in_RDI;
  
  ~vw_exception(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

const char* vw_exception::what() const _NOEXCEPT { return message.c_str(); }